

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildAsmCall
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,ArgSlot argCount,RegSlot ret,
          RegSlot function,int8 returnType,ProfileId profileId)

{
  Func *pFVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  ProfileId PVar5;
  RegSlot RVar6;
  int iVar7;
  RegOpnd *pRVar8;
  RegOpnd *pRVar9;
  ProfiledInstr *instr;
  JITTimeFunctionBody *pJVar10;
  Type *pTVar11;
  Type *ppIVar12;
  StackSym *pSVar13;
  Opnd *pOVar14;
  IntConstOpnd *this_00;
  undefined4 *puVar15;
  IRType IVar16;
  SList<int,_Memory::ArenaAllocator,_RealCount> *this_01;
  SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *pSVar17;
  ulong value;
  undefined6 in_register_00000032;
  uint uVar18;
  int iVar19;
  ProfiledInstr *pPVar20;
  ProfiledInstr *pPVar21;
  ushort local_58;
  
  iVar19 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (1 < iVar19 - 0x1dU) {
    if (iVar19 == 0x12) {
      RVar6 = GetRegSlotFromTypedReg(this,function,INT64);
      pRVar8 = BuildSrcOpnd(this,RVar6,TyInt64);
      RVar6 = GetRegSlotFromTypedReg(this,ret,INT64);
      pRVar9 = BuildDstOpnd(this,RVar6,TyInt64);
      instr = (ProfiledInstr *)
              IR::Instr::New(AsmJsCallE,&pRVar9->super_Opnd,&pRVar8->super_Opnd,this->m_func);
      iVar19 = 0;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x717,"((0))","(0)");
      if (!bVar4) goto LAB_004f83fc;
      *puVar15 = 0;
      iVar19 = 0;
      instr = (ProfiledInstr *)0x0;
    }
    goto LAB_004f7e79;
  }
  RVar6 = GetRegSlotFromTypedReg(this,function,INT64);
  pRVar8 = BuildSrcOpnd(this,RVar6,TyInt64);
  switch(returnType) {
  case '\x01':
    RVar6 = GetRegSlotFromTypedReg(this,ret,INT64);
    IVar16 = TyInt64;
    goto LAB_004f7c27;
  case '\x02':
    RVar6 = GetRegSlotFromTypedReg(this,ret,FLOAT64);
    IVar16 = TyFloat64;
    goto LAB_004f7bf6;
  case '\x03':
    RVar6 = GetRegSlotFromTypedReg(this,ret,FLOAT32);
    IVar16 = TyFloat32;
LAB_004f7bf6:
    pRVar9 = BuildDstOpnd(this,RVar6,IVar16);
    valueType.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
    goto LAB_004f7c3b;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x6f8,"((0))","(0)");
    if (!bVar4) goto LAB_004f83fc;
    *puVar15 = 0;
  case '\r':
    pRVar9 = (RegOpnd *)0x0;
    goto LAB_004f7c86;
  case '\n':
    RVar6 = GetRegSlotFromTypedReg(this,ret,INT32);
    IVar16 = TyInt32;
LAB_004f7c27:
    pRVar9 = BuildDstOpnd(this,RVar6,IVar16);
    valueType.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
LAB_004f7c3b:
    IR::Opnd::SetValueType(&pRVar9->super_Opnd,(ValueType)valueType.field_0);
    goto LAB_004f7c86;
  case '\x0e':
    RVar6 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar16 = TySimd128I4;
    break;
  case '\x0f':
    RVar6 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar16 = TySimd128U4;
    break;
  case '\x10':
    RVar6 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar16 = TySimd128I8;
    break;
  case '\x11':
    RVar6 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar16 = TySimd128I16;
    break;
  case '\x12':
    RVar6 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar16 = TySimd128U8;
    break;
  case '\x13':
    RVar6 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar16 = TySimd128U16;
    break;
  case '\x14':
    RVar6 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar16 = TySimd128B4;
    break;
  case '\x15':
    RVar6 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar16 = TySimd128B8;
    break;
  case '\x16':
    RVar6 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar16 = TySimd128B16;
    break;
  case '\x17':
    RVar6 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar16 = TySimd128F4;
    break;
  case '\x18':
    RVar6 = GetRegSlotFromTypedReg(this,ret,SIMD);
    IVar16 = TySimd128D2;
  }
  pRVar9 = BuildDstOpnd(this,RVar6,IVar16);
LAB_004f7c86:
  if (profileId == 0xffff) {
    instr = (ProfiledInstr *)
            IR::Instr::New(AsmJsCallI,&pRVar9->super_Opnd,&pRVar8->super_Opnd,this->m_func);
  }
  else {
    if (newOpcode != ProfiledI_Call) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x702,"(newOpcode == Js::OpCodeAsmJs::ProfiledI_Call)",
                         "newOpcode == Js::OpCodeAsmJs::ProfiledI_Call");
      if (!bVar4) goto LAB_004f83fc;
      *puVar15 = 0;
    }
    instr = IR::ProfiledInstr::New(AsmJsCallI,&pRVar9->super_Opnd,&pRVar8->super_Opnd,this->m_func);
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    PVar5 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar10);
    if (PVar5 <= profileId) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x704,
                         "(profileId < m_func->GetJITFunctionBody()->GetProfiledCallSiteCount())",
                         "profileId < m_func->GetJITFunctionBody()->GetProfiledCallSiteCount()");
      if (!bVar4) goto LAB_004f83fc;
      *puVar15 = 0;
    }
    if ((instr->super_Instr).m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar4) goto LAB_004f83fc;
      *puVar15 = 0;
    }
    *(uint *)&instr->u = (uint)profileId;
  }
  this_01 = this->m_argOffsetStack;
  if ((SList<int,_Memory::ArenaAllocator,_RealCount> *)
      (this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this_01) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x708,"(!this->m_argOffsetStack->Empty())",
                       "!this->m_argOffsetStack->Empty()");
    if (!bVar4) goto LAB_004f83fc;
    *puVar15 = 0;
    this_01 = this->m_argOffsetStack;
  }
  pTVar11 = SListBase<int,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>);
  iVar19 = *pTVar11;
  SListBase<int,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&this_01->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>,this_01->allocator);
  iVar19 = iVar19 + -8;
LAB_004f7e79:
  AddInstr(this,&instr->super_Instr,offset);
  pSVar17 = (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)this->m_argStack;
  if ((SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
      (pSVar17->super_SListNodeBase<Memory::ArenaAllocator>).next == pSVar17) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x71e,"(!this->m_argStack->Empty())","!this->m_argStack->Empty()");
    if (!bVar4) goto LAB_004f83fc;
    *puVar15 = 0;
    pSVar17 = (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)this->m_argStack;
  }
  ppIVar12 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Head(pSVar17);
  pPVar21 = (ProfiledInstr *)*ppIVar12;
  SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (pSVar17,(ArenaAllocator *)pSVar17[1].super_SListNodeBase<Memory::ArenaAllocator>.next);
  if ((SListCounted<IR::Instr_*,_Memory::ArenaAllocator> *)
      (this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next == this->m_argStack) {
    value = 0;
  }
  else {
    local_58 = newOpcode - I_Call;
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar18 = 0;
    pPVar20 = pPVar21;
    do {
      pPVar21 = pPVar20;
      if ((pPVar20->super_Instr).m_opcode == StartCall) break;
      if (local_58 < 2) {
        pOVar14 = (pPVar20->super_Instr).m_dst;
        iVar7 = TySize[pOVar14->m_type];
        if (iVar7 < 9) {
          iVar7 = 8;
        }
        iVar19 = iVar19 - iVar7;
        pSVar13 = IR::Opnd::GetStackSym(pOVar14);
        pSVar13->m_offset = iVar19;
      }
      pOVar14 = (pPVar20->super_Instr).m_dst;
      if ((instr->super_Instr).m_src2 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
        if (!bVar4) goto LAB_004f83fc;
        *puVar15 = 0;
      }
      pFVar1 = (instr->super_Instr).m_func;
      if (pOVar14->isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar4) goto LAB_004f83fc;
        *puVar15 = 0;
      }
      bVar3 = pOVar14->field_0xb;
      if ((bVar3 & 2) != 0) {
        pOVar14 = IR::Opnd::Copy(pOVar14,pFVar1);
        bVar3 = pOVar14->field_0xb;
      }
      pOVar14->field_0xb = bVar3 | 2;
      (instr->super_Instr).m_src2 = pOVar14;
      uVar18 = uVar18 + 1;
      pSVar17 = (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)this->m_argStack;
      ppIVar12 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Head(pSVar17);
      pPVar21 = (ProfiledInstr *)*ppIVar12;
      SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                (pSVar17,(ArenaAllocator *)
                         pSVar17[1].super_SListNodeBase<Memory::ArenaAllocator>.next);
      instr = pPVar20;
      pPVar20 = pPVar21;
    } while ((SListCounted<IR::Instr_*,_Memory::ArenaAllocator> *)
             (this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next != this->m_argStack);
    value = (ulong)(uVar18 & 0xffff);
  }
  if ((pPVar21->super_Instr).m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x733,"(argInstr->m_opcode == Js::OpCode::StartCall)",
                       "argInstr->m_opcode == Js::OpCode::StartCall");
    if (!bVar4) goto LAB_004f83fc;
    *puVar15 = 0;
  }
  this_00 = IR::IntConstOpnd::New(value,TyUint16,this->m_func,false);
  if ((pPVar21->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_004f83fc;
    *puVar15 = 0;
  }
  pFVar1 = (pPVar21->super_Instr).m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) goto LAB_004f83fc;
    *puVar15 = 0;
  }
  bVar3 = (this_00->super_Opnd).field_0xb;
  if ((bVar3 & 2) != 0) {
    this_00 = (IntConstOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
    bVar3 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar3 | 2;
  (pPVar21->super_Instr).m_src1 = &this_00->super_Opnd;
  if (iVar19 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x736,"(argOffset == 0)","argOffset == 0");
    if (!bVar4) goto LAB_004f83fc;
    *puVar15 = 0;
  }
  pOVar14 = (pPVar21->super_Instr).m_dst;
  if ((instr->super_Instr).m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_004f83fc;
    *puVar15 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  if (pOVar14->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_004f83fc:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar15 = 0;
  }
  bVar3 = pOVar14->field_0xb;
  if ((bVar3 & 2) != 0) {
    pOVar14 = IR::Opnd::Copy(pOVar14,pFVar1);
    bVar3 = pOVar14->field_0xb;
  }
  pOVar14->field_0xb = bVar3 | 2;
  (instr->super_Instr).m_src2 = pOVar14;
  if (this->m_func->m_argSlotsForFunctionsCalled < (uint)argCount) {
    this->m_func->m_argSlotsForFunctionsCalled = (uint)argCount;
  }
  bVar4 = AsmJsJITInfo::UsesHeapBuffer(this->m_asmFuncInfo);
  if (bVar4) {
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar4 = JITTimeFunctionBody::IsWasmFunction(pJVar10);
    if (bVar4) {
      BuildHeapBufferReload(this,offset,false);
      return;
    }
  }
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildAsmCall(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::ArgSlot argCount, Js::RegSlot ret, Js::RegSlot function, int8 returnType, Js::ProfileId profileId)
{
    Js::ArgSlot count = 0;

    IR::Instr * instr = nullptr;
    IR::RegOpnd * dstOpnd = nullptr;
    IR::Opnd * srcOpnd = nullptr;
    Js::RegSlot dstRegSlot;
    Js::RegSlot srcRegSlot;
    int32 argOffset = 0;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::I_Call:
    case Js::OpCodeAsmJs::ProfiledI_Call:
        srcRegSlot = GetRegSlotFromPtrReg(function);
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyMachReg);

        switch ((Js::AsmJsRetType::Which)returnType)
        {
        case Js::AsmJsRetType::Which::Signed:
            dstRegSlot = GetRegSlotFromIntReg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
            dstOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Float:
            dstRegSlot = GetRegSlotFromFloatReg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat32);
            dstOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsRetType::Which::Double:
            dstRegSlot = GetRegSlotFromDoubleReg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat64);
            dstOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsRetType::Which::Int64:
            dstRegSlot = GetRegSlotFromInt64Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
            dstOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Void:
            break;

#ifdef ENABLE_WASM_SIMD
        case Js::AsmJsRetType::Which::Float32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128F4);
            break;
        case Js::AsmJsRetType::Which::Int32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I4);
            break;
        case Js::AsmJsRetType::Which::Bool32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128B4);
            break;
        case Js::AsmJsRetType::Which::Bool16x8:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128B8);
            break;
        case Js::AsmJsRetType::Which::Bool8x16:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128B16);
            break;
        case Js::AsmJsRetType::Which::Float64x2:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128D2);
            break;
        case Js::AsmJsRetType::Which::Int16x8:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I8);
            break;
        case Js::AsmJsRetType::Which::Int8x16:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I16);
            break;
        case Js::AsmJsRetType::Which::Uint32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U4);
            break;
        case Js::AsmJsRetType::Which::Uint16x8:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U8);
            break;
        case Js::AsmJsRetType::Which::Uint8x16:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U16);
            break;
#endif
        default:
            Assume(UNREACHED);
        }

        {
            if (profileId == Js::Constants::NoProfileId)
            {
                instr = IR::Instr::New(Js::OpCode::AsmJsCallI, dstOpnd, srcOpnd, m_func);
            }
            else
            {
                Assert(newOpcode == Js::OpCodeAsmJs::ProfiledI_Call);
                instr = IR::ProfiledInstr::New(Js::OpCode::AsmJsCallI, dstOpnd, srcOpnd, m_func);
                AssertOrFailFast(profileId < m_func->GetJITFunctionBody()->GetProfiledCallSiteCount());
                instr->AsProfiledInstr()->u.profileId = profileId;
            }
        }
        AssertOrFailFast(!this->m_argOffsetStack->Empty());
        argOffset = m_argOffsetStack->Pop();
        argOffset -= MachPtr;
        break;

    case Js::OpCodeAsmJs::Call:
        srcRegSlot = GetRegSlotFromPtrReg(function);
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyMachReg);

        dstRegSlot = GetRegSlotFromPtrReg(ret);
        dstOpnd = BuildDstOpnd(dstRegSlot, TyMachReg);

        instr = IR::Instr::New(Js::OpCode::AsmJsCallE, dstOpnd, srcOpnd, m_func);
        break;
    default:
        Assume(UNREACHED);
    }
    AddInstr(instr, offset);

    IR::Instr * argInstr = nullptr;
    IR::Instr * prevInstr = instr;

    AssertOrFailFast(!this->m_argStack->Empty());
    for (argInstr = m_argStack->Pop(); !m_argStack->Empty() && argInstr->m_opcode != Js::OpCode::StartCall; argInstr = m_argStack->Pop())
    {
        if (newOpcode == Js::OpCodeAsmJs::I_Call || newOpcode == Js::OpCodeAsmJs::ProfiledI_Call)
        {
#if _M_IX86
            argOffset -= argInstr->GetDst()->GetSize();
#elif _M_X64
            argOffset -= (argInstr->GetDst()->GetSize() <= MachPtr ? MachPtr : argInstr->GetDst()->GetSize());
#else
            Assert(UNREACHED);
#endif
            argInstr->GetDst()->GetStackSym()->m_offset = argOffset;

        }
        // associate the ArgOuts with this call via src2
        prevInstr->SetSrc2(argInstr->GetDst());
        prevInstr = argInstr;
        count++;
    }

    AssertOrFailFast(argInstr->m_opcode == Js::OpCode::StartCall);
    argInstr->SetSrc1(IR::IntConstOpnd::New(count, TyUint16, m_func));

    AssertOrFailFast(argOffset == 0);
    prevInstr->SetSrc2(argInstr->GetDst());

    // todo:: are we sure we don't need this for wasm ?
#ifdef ENABLE_SIMDJS
#if defined(_M_X64)
    // Without SIMD vars, all args are Var in size. So offset in Var = arg position in args list.
    // With SIMD, args have variable size, so we need to track argument position in the args list to be able to assign arg register for first four args on x64.
    if (m_func->IsSIMDEnabled())
    {
        for (uint i = 1; !m_tempList->Empty(); i++)
        {
            IR::Instr * instrArg = m_tempList->Pop();
            // record argument position and make room for implicit args
            instrArg->GetDst()->GetStackSym()->m_argPosition = i;
            if (newOpcode == Js::OpCodeAsmJs::I_Call || newOpcode == Js::OpCodeAsmJs::ProfiledI_Call)
            {
                // implicit func obj arg
                instrArg->GetDst()->GetStackSym()->m_argPosition += 1;
            }
            else
            {
                // implicit func obj + callInfo args
                Assert(newOpcode == Js::OpCodeAsmJs::Call);
                instrArg->GetDst()->GetStackSym()->m_argPosition += 2;
            }
        }
    }
#endif
#endif
    if (m_func->m_argSlotsForFunctionsCalled < argCount)
    {
        m_func->m_argSlotsForFunctionsCalled = argCount;
    }
#ifdef ENABLE_WASM
    // heap buffer can change for wasm
    if (m_asmFuncInfo->UsesHeapBuffer() && m_func->GetJITFunctionBody()->IsWasmFunction())
    {
        BuildHeapBufferReload(offset);
    }
#endif
}